

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O2

NumberFormat *
icu_63::NumberFormat::internalCreateInstance(Locale *loc,UNumberFormatStyle kind,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  NumberFormat *pNVar3;
  UErrorCode kvStatus;
  char cfKeyValue [32];
  
  if (kind == UNUM_CURRENCY) {
    cfKeyValue[0x10] = '\0';
    cfKeyValue[0x11] = '\0';
    cfKeyValue[0x12] = '\0';
    cfKeyValue[0x13] = '\0';
    cfKeyValue[0x14] = '\0';
    cfKeyValue[0x15] = '\0';
    cfKeyValue[0x16] = '\0';
    cfKeyValue[0x17] = '\0';
    cfKeyValue[0x18] = '\0';
    cfKeyValue[0x19] = '\0';
    cfKeyValue[0x1a] = '\0';
    cfKeyValue[0x1b] = '\0';
    cfKeyValue[0x1c] = '\0';
    cfKeyValue[0x1d] = '\0';
    cfKeyValue[0x1e] = '\0';
    cfKeyValue[0x1f] = '\0';
    cfKeyValue[0] = '\0';
    cfKeyValue[1] = '\0';
    cfKeyValue[2] = '\0';
    cfKeyValue[3] = '\0';
    cfKeyValue[4] = '\0';
    cfKeyValue[5] = '\0';
    cfKeyValue[6] = '\0';
    cfKeyValue[7] = '\0';
    cfKeyValue[8] = '\0';
    cfKeyValue[9] = '\0';
    cfKeyValue[10] = '\0';
    cfKeyValue[0xb] = '\0';
    cfKeyValue[0xc] = '\0';
    cfKeyValue[0xd] = '\0';
    cfKeyValue[0xe] = '\0';
    cfKeyValue[0xf] = '\0';
    kvStatus = U_ZERO_ERROR;
    iVar2 = Locale::getKeywordValue(loc,"cf",cfKeyValue,0x20,&kvStatus);
    kind = UNUM_CURRENCY_ACCOUNTING;
    if (cfKeyValue._0_8_ != 0x746e756f636361) {
      kind = UNUM_CURRENCY;
    }
    if (U_ZERO_ERROR < kvStatus) {
      kind = UNUM_CURRENCY;
    }
    if (iVar2 < 1) {
      kind = UNUM_CURRENCY;
    }
  }
  UVar1 = haveService();
  if (UVar1 == '\0') {
    pNVar3 = makeInstance(loc,kind,status);
  }
  else {
    pNVar3 = (NumberFormat *)ICULocaleService::get(gService,loc,kind,status);
  }
  return pNVar3;
}

Assistant:

NumberFormat*
NumberFormat::internalCreateInstance(const Locale& loc, UNumberFormatStyle kind, UErrorCode& status) {
    if (kind == UNUM_CURRENCY) {
        char cfKeyValue[kKeyValueLenMax] = {0};
        UErrorCode kvStatus = U_ZERO_ERROR;
        int32_t kLen = loc.getKeywordValue("cf", cfKeyValue, kKeyValueLenMax, kvStatus);
        if (U_SUCCESS(kvStatus) && kLen > 0 && uprv_strcmp(cfKeyValue,"account")==0) {
            kind = UNUM_CURRENCY_ACCOUNTING;
        }
    }
#if !UCONFIG_NO_SERVICE
    if (haveService()) {
        return (NumberFormat*)gService->get(loc, kind, status);
    }
#endif
    return makeInstance(loc, kind, status);
}